

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O3

REF_STATUS ref_adapt_deep_copy(REF_ADAPT *ref_adapt_ptr,REF_ADAPT original)

{
  REF_DBL RVar1;
  REF_INT RVar2;
  REF_BOOL RVar3;
  REF_BOOL RVar4;
  REF_STATUS RVar5;
  REF_ADAPT pRVar6;
  
  pRVar6 = (REF_ADAPT)malloc(0x88);
  *ref_adapt_ptr = pRVar6;
  if (pRVar6 == (REF_ADAPT)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x54,
           "ref_adapt_deep_copy","malloc *ref_adapt_ptr of REF_ADAPT_STRUCT NULL");
    RVar5 = 2;
  }
  else {
    pRVar6->split_ratio_growth = original->split_ratio_growth;
    RVar1 = original->split_quality_absolute;
    pRVar6->split_ratio = original->split_ratio;
    pRVar6->split_quality_absolute = RVar1;
    RVar1 = original->collapse_ratio;
    pRVar6->split_quality_relative = original->split_quality_relative;
    pRVar6->collapse_ratio = RVar1;
    RVar1 = original->smooth_min_quality;
    pRVar6->collapse_quality_absolute = original->collapse_quality_absolute;
    pRVar6->smooth_min_quality = RVar1;
    pRVar6->smooth_pliant_alpha = original->smooth_pliant_alpha;
    pRVar6->swap_max_degree = original->swap_max_degree;
    RVar1 = original->post_min_normdev;
    pRVar6->swap_min_quality = original->swap_min_quality;
    pRVar6->post_min_normdev = RVar1;
    RVar1 = original->post_max_ratio;
    pRVar6->post_min_ratio = original->post_min_ratio;
    pRVar6->post_max_ratio = RVar1;
    RVar1 = original->last_max_ratio;
    pRVar6->last_min_ratio = original->last_min_ratio;
    pRVar6->last_max_ratio = RVar1;
    RVar2 = original->timing_level;
    RVar3 = original->watch_param;
    RVar4 = original->watch_topo;
    pRVar6->unlock_tet = original->unlock_tet;
    pRVar6->timing_level = RVar2;
    pRVar6->watch_param = RVar3;
    pRVar6->watch_topo = RVar4;
    RVar5 = 0;
  }
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_adapt_deep_copy(REF_ADAPT *ref_adapt_ptr,
                                       REF_ADAPT original) {
  REF_ADAPT ref_adapt;

  ref_malloc(*ref_adapt_ptr, 1, REF_ADAPT_STRUCT);

  ref_adapt = *ref_adapt_ptr;

  ref_adapt->split_ratio_growth = original->split_ratio_growth;
  ref_adapt->split_ratio = original->split_ratio;
  ref_adapt->split_quality_absolute = original->split_quality_absolute;
  ref_adapt->split_quality_relative = original->split_quality_relative;

  ref_adapt->collapse_ratio = original->collapse_ratio;
  ref_adapt->collapse_quality_absolute = original->collapse_quality_absolute;

  ref_adapt->smooth_min_quality = original->smooth_min_quality;
  ref_adapt->smooth_pliant_alpha = original->smooth_pliant_alpha;

  ref_adapt->swap_max_degree = original->swap_max_degree;
  ref_adapt->swap_min_quality = original->swap_min_quality;

  ref_adapt->post_min_normdev = original->post_min_normdev;
  ref_adapt->post_min_ratio = original->post_min_ratio;
  ref_adapt->post_max_ratio = original->post_max_ratio;

  ref_adapt->last_min_ratio = original->last_min_ratio;
  ref_adapt->last_max_ratio = original->last_max_ratio;

  ref_adapt->unlock_tet = original->unlock_tet;

  ref_adapt->timing_level = original->timing_level;
  ref_adapt->watch_param = original->watch_param;
  ref_adapt->watch_topo = original->watch_topo;

  return REF_SUCCESS;
}